

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3243::EvaluateSectionPoint
          (ChElementBeamANCF_3243 *this,double xi,ChVector<double> *point)

{
  VectorN Sxi_compact;
  Matrix3xN e_bar;
  Matrix3xN *local_190;
  VectorN *local_188;
  VectorN local_180;
  Matrix3xN local_140;
  
  Calc_Sxi_compact(this,&local_180,xi,0.0,0.0);
  CalcCoordMatrix(this,&local_140);
  local_190 = &local_140;
  local_188 = &local_180;
  ChVector<double>::operator=
            (point,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>_>
                    *)&local_190);
  return;
}

Assistant:

void ChElementBeamANCF_3243::EvaluateSectionPoint(const double xi, ChVector<>& point) {
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, 0, 0);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // r = S*e written in compact form
    point = e_bar * Sxi_compact;
}